

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_types.hpp
# Opt level: O3

uint64_t __thiscall
pstore::index::fnv_64a_hash_indirect_string::operator()
          (fnv_64a_hash_indirect_string *this,indirect_string *indir)

{
  long lVar1;
  uint64_t uVar2;
  raw_sstring_view rVar3;
  shared_sstring_view owner;
  sstring_view<std::shared_ptr<const_char>_> local_48;
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> local_30;
  extent_type<_1L> local_28 [2];
  
  local_30.ptr_ = &local_48;
  local_48.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_48.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48.size_ = 0;
  gsl::not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*>::ensure_invariant(&local_30);
  rVar3 = indirect_string::as_string_view(indir,local_30);
  uVar2 = 0xcbf29ce484222325;
  gsl::details::extent_type<-1L>::extent_type(local_28,rVar3.size_);
  if (local_28[0].size_ == 0) {
    uVar2 = 0xcbf29ce484222325;
  }
  else {
    lVar1 = 0;
    do {
      uVar2 = ((byte)rVar3.ptr_[lVar1] ^ uVar2) * 0x100000001b3;
      lVar1 = lVar1 + 1;
    } while (local_28[0].size_ != lVar1);
  }
  if (local_48.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return uVar2;
}

Assistant:

std::uint64_t operator() (indirect_string const & indir) const {
                shared_sstring_view owner;
                return fnv_64a_hash () (indir.as_string_view (&owner));
            }